

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

bool __thiscall
Memory::LargeHeapBlock::TryGetAttributes
          (LargeHeapBlock *this,LargeObjectHeader *header,uchar *pAttr)

{
  uchar uVar1;
  
  if ((((LargeObjectHeader *)(this->super_HeapBlock).address <= header) &&
      (header->objectIndex < this->allocCount)) &&
     ((LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[header->objectIndex] == header
     )) {
    uVar1 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
    *pAttr = uVar1;
    return true;
  }
  return false;
}

Assistant:

bool
LargeHeapBlock::TryGetAttributes(LargeObjectHeader * header, unsigned char * pAttr)
{
    if ((char *)header < this->address)
    {
        return false;
    }

    uint index = header->objectIndex;

    if (index >= this->allocCount)
    {
        // Not allocated yet.
        return false;
    }

    if (this->HeaderList()[index] != header)
    {
        // header doesn't match, not a real object
        return false;
    }

    *pAttr = header->GetAttributes(this->heapInfo->recycler->Cookie);
    return true;
}